

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# consolelog.hpp
# Opt level: O3

void __thiscall
github111116::ConsoleLogger::info<char[13],int,char,int,char,int,char[4]>
          (ConsoleLogger *this,char (*args) [13],int *args_1,char *args_2,int *args_3,char *args_4,
          int *args_5,char (*args_6) [4])

{
  int iVar1;
  
  if (1 < this->loglevel) {
    return;
  }
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->mtx);
  if (iVar1 == 0) {
    if (this->colored == true) {
      std::__ostream_insert<char,std::char_traits<char>>
                (this->out,(this->infoColor)._M_dataplus._M_p,(this->infoColor)._M_string_length);
    }
    std::__ostream_insert<char,std::char_traits<char>>(this->out,"[i] ",4);
    if (this->colored == true) {
      std::__ostream_insert<char,std::char_traits<char>>(this->out,"\x1b[0m",4);
    }
    print<char[13],int,char,int,char,int,char[4]>
              (this,args,args_1,args_2,args_3,args_4,args_5,args_6);
    pthread_mutex_unlock((pthread_mutex_t *)&this->mtx);
    return;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

void ConsoleLogger::info(const Args&... args)
{
	if (loglevel > 1) return;
	mtx.lock();
	if (colored) out << infoColor;
	out << "[i] ";
	if (colored) out << "\033[0m";
	print(args...);
	mtx.unlock();
}